

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *puVar4;
  long lVar5;
  int *c;
  int *piVar6;
  uint8_t uVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  uint i;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint8_t new_typecode;
  uint8_t local_41;
  size_t local_40;
  uint32_t *local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    i = 0xffffffff;
    sVar12 = 0;
    local_40 = n_args;
    local_38 = vals;
    do {
      uVar2 = local_38[sVar12];
      uVar9 = (ushort)(uVar2 >> 0x10);
      if (((int)i < 0) || (uVar2 >> 0x10 != (uint)(r->high_low_container).keys[i])) {
        iVar3 = (r->high_low_container).size;
        if (((long)iVar3 == 0) ||
           (puVar4 = (r->high_low_container).keys, puVar4[(long)iVar3 + -1] == uVar9)) {
          i = iVar3 - 1;
        }
        else {
          uVar13 = iVar3 - 1;
          uVar11 = 0;
          uVar14 = uVar13;
          do {
            if ((int)uVar13 < (int)uVar11) {
              i = ~uVar11;
              break;
            }
            i = uVar11 + uVar13 >> 1;
            uVar1 = *(ushort *)((long)puVar4 + (ulong)(uVar11 + uVar13 & 0xfffffffe));
            if (uVar1 < uVar9) {
              uVar11 = i + 1;
              bVar15 = true;
              i = uVar14;
            }
            else if (uVar9 < uVar1) {
              uVar13 = i - 1;
              bVar15 = true;
              i = uVar14;
            }
            else {
              bVar15 = false;
            }
            uVar14 = i;
          } while (bVar15);
        }
      }
      if (-1 < (int)i) {
        c = (int *)container_remove((r->high_low_container).containers[i],(uint16_t)uVar2,
                                    (r->high_low_container).typecodes[i],&local_41);
        piVar6 = (int *)(r->high_low_container).containers[i];
        if (c != piVar6) {
          container_free(piVar6,(r->high_low_container).typecodes[i]);
          if ((r->high_low_container).size <= (int)i) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          (r->high_low_container).keys[i] = uVar9;
          (r->high_low_container).containers[i] = c;
          (r->high_low_container).typecodes[i] = local_41;
        }
        piVar6 = c;
        uVar7 = local_41;
        if (local_41 == '\x04') {
          uVar7 = (uint8_t)c[2];
          if (uVar7 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar6 = *(int **)c;
        }
        if ((uVar7 == '\x03') || (uVar7 == '\x02')) {
          bVar15 = 0 < *piVar6;
        }
        else {
          if (uVar7 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar6 == -1) {
            if (**(long **)(piVar6 + 2) == 0) {
              uVar8 = 0xffffffffffffffff;
              do {
                if (uVar8 == 0x3fe) {
                  uVar10 = 0x3ff;
                  break;
                }
                uVar10 = uVar8 + 1;
                lVar5 = uVar8 + 2;
                uVar8 = uVar10;
              } while ((*(long **)(piVar6 + 2))[lVar5] == 0);
              bVar15 = 0x3fe < uVar10;
            }
            else {
              bVar15 = false;
            }
          }
          else {
            bVar15 = *piVar6 == 0;
          }
          bVar15 = (bool)(bVar15 ^ 1);
        }
        if (!bVar15) {
          container_free(c,local_41);
          ra_remove_at_index(&r->high_low_container,i);
          i = 0xffffffff;
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != local_40);
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos = -1; // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(r->high_low_container.containers[pos],
                                             vals[i] & 0xffff,
                                             r->high_low_container.typecodes[pos],
                                             &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}